

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int find_curlybracket(char **string)

{
  char cVar1;
  int iVar2;
  char **ppcVar3;
  char *local_20;
  
  ppcVar3 = string;
LAB_0010cf8e:
  do {
    local_20 = *ppcVar3;
    cVar1 = *local_20;
    ppcVar3 = &local_20;
    if (cVar1 == '\"') {
      local_20 = local_20 + 1;
      iVar2 = find_doublequote(&local_20);
    }
    else if (cVar1 == '\'') {
      local_20 = local_20 + 1;
      iVar2 = find_quote(&local_20);
    }
    else if (cVar1 == '(') {
      local_20 = local_20 + 1;
      iVar2 = find_paren(&local_20);
    }
    else if (cVar1 == '[') {
      local_20 = local_20 + 1;
      iVar2 = find_bracket(&local_20);
    }
    else {
      if (cVar1 != '{') {
        if (cVar1 == '\0') {
          return 1;
        }
        if (cVar1 == '}') {
          *string = local_20 + 1;
          return 0;
        }
        local_20 = local_20 + 1;
        goto LAB_0010cf8e;
      }
      local_20 = local_20 + 1;
      iVar2 = find_curlybracket(&local_20);
    }
    if (iVar2 != 0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int find_curlybracket(char **string)

/*  
    look for the closing curly bracket character in the input string
*/
{
    char *tstr;

    tstr = *string;

    while (*tstr) {
        if (*tstr == '}') { /* found the closing curly bracket */
           *string = tstr + 1;  /* set pointer to next char */
           return(0); 
        } else if (*tstr == '(') { /* found another level of parens */
           tstr++;
           if (find_paren(&tstr)) return(1); 
        } else if (*tstr == '[') { 
           tstr++;
           if (find_bracket(&tstr)) return(1);
        } else if (*tstr == '{') { 
           tstr++;
           if (find_curlybracket(&tstr)) return(1);
        } else if (*tstr == '"') { 
           tstr++;
           if (find_doublequote(&tstr)) return(1);
        } else if (*tstr == '\'') { 
           tstr++;
           if (find_quote(&tstr)) return(1);
        } else { 
           tstr++;
        }
    }
    return(1);  /* opps, didn't find the closing character */
}